

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O3

bool dxil_spv::analyze_getelementptr_instruction(Impl *impl,GetElementPtrInst *inst)

{
  undefined4 uVar1;
  undefined8 uVar2;
  GlobalVariable *pGVar3;
  bool bVar4;
  ValueKind VVar5;
  uint uVar6;
  iterator iVar7;
  Value *pVVar8;
  mapped_type *pmVar9;
  LoggingCallback p_Var10;
  void *pvVar11;
  __hashtable *__h;
  __node_gen_type __node_gen;
  AllocaTrackedIndex tracking;
  GetElementPtrInst *local_1040;
  undefined1 local_1038 [16];
  Value local_1028;
  char acStack_1010 [4064];
  
  local_1040 = inst;
  local_1038._0_8_ = LLVMBC::Instruction::getOperand(&inst->super_Instruction,0);
  iVar7 = std::
          _Hashtable<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(impl->llvm_global_variable_to_resource_mapping)._M_h,(key_type *)local_1038);
  if (iVar7.
      super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
      ._M_cur == (__node_type *)0x0) {
LAB_0015676f:
    gep_pointer_to_alloca_tracked_inst((AllocaTrackedIndex *)local_1038,impl,(Value *)inst);
    if ((GetElementPtrInst *)local_1038._0_8_ != (GetElementPtrInst *)0x0) {
      std::
      _Hashtable<LLVMBC::GetElementPtrInst_const*,LLVMBC::GetElementPtrInst_const*,dxil_spv::ThreadLocalAllocator<LLVMBC::GetElementPtrInst_const*>,std::__detail::_Identity,std::equal_to<LLVMBC::GetElementPtrInst_const*>,std::hash<LLVMBC::GetElementPtrInst_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<LLVMBC::GetElementPtrInst_const*const&,std::__detail::_AllocNode<dxil_spv::ThreadLocalAllocator<std::__detail::_Hash_node<LLVMBC::GetElementPtrInst_const*,false>>>>
                ((_Hashtable<LLVMBC::GetElementPtrInst_const*,LLVMBC::GetElementPtrInst_const*,dxil_spv::ThreadLocalAllocator<LLVMBC::GetElementPtrInst_const*>,std::__detail::_Identity,std::equal_to<LLVMBC::GetElementPtrInst_const*>,std::hash<LLVMBC::GetElementPtrInst_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&impl->masked_alloca_forward_gep,&local_1040);
    }
    bVar4 = true;
  }
  else {
    pVVar8 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,1);
    pVVar8 = LLVMBC::Internal::resolve_proxy(pVVar8);
    VVar5 = LLVMBC::Value::get_value_kind(pVVar8);
    if (VVar5 == ConstantInt) {
      uVar6 = LLVMBC::Instruction::getNumOperands(&inst->super_Instruction);
      if (uVar6 == 3) {
        uVar2 = *(undefined8 *)
                 ((long)iVar7.
                        super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                        ._M_cur + 0x10);
        pGVar3 = *(GlobalVariable **)
                  ((long)iVar7.
                         super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                         ._M_cur + 0x20);
        uVar6 = *(uint *)((long)iVar7.
                                super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                                ._M_cur + 0x2c);
        uVar1 = *(undefined4 *)
                 ((long)iVar7.
                        super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                        ._M_cur + 0x29);
        pVVar8 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,2);
        local_1028.type._0_5_ = 0x6f6e2e7864;
        local_1028.type._5_3_ = 0x6e756e;
        local_1028.kind = 0x726f6669;
        local_1028._12_1_ = 0x6d;
        local_1038._8_8_ = (Value *)0xd;
        local_1028._13_1_ = '\0';
        local_1038._0_8_ = &local_1028;
        bVar4 = LLVMBC::Instruction::hasMetadata(&inst->super_Instruction,(String *)local_1038);
        if ((Value *)local_1038._0_8_ != &local_1028) {
          free_in_thread((void *)local_1038._0_8_);
        }
        local_1038._0_8_ = inst;
        pmVar9 = std::__detail::
                 _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&impl->llvm_global_variable_to_resource_mapping,
                              (key_type *)local_1038);
        pmVar9->type = (char)uVar2;
        *(int3 *)&pmVar9->field_0x1 = (int3)((ulong)uVar2 >> 8);
        pmVar9->meta_index = (int)((ulong)uVar2 >> 0x20);
        pmVar9->offset = pVVar8;
        pmVar9->variable = pGVar3;
        pmVar9->non_uniform = bVar4;
        *(undefined4 *)&pmVar9->field_0x19 = uVar1;
        *(int *)&pmVar9->field_0x1c = (int)(CONCAT44(uVar6 >> 8,uVar1) >> 0x18);
        goto LAB_0015676f;
      }
      p_Var10 = get_thread_log_callback();
      if (p_Var10 != (LoggingCallback)0x0) {
        memcpy(local_1038,
               "Number of operands to getelementptr for a resource handle is unexpected.\n",0x4a);
        goto LAB_00156805;
      }
      analyze_getelementptr_instruction();
    }
    else {
      p_Var10 = get_thread_log_callback();
      if (p_Var10 == (LoggingCallback)0x0) {
        analyze_getelementptr_instruction();
      }
      else {
        local_1028.tween_id._0_1_ = 'o';
        local_1028.tween_id._1_1_ = 't';
        local_1028.tween_id._2_1_ = ' ';
        local_1028.tween_id._3_1_ = 'c';
        local_1028.tween_id._4_1_ = 'o';
        local_1028.tween_id._5_1_ = 'n';
        local_1028.tween_id._6_1_ = 's';
        local_1028.tween_id._7_1_ = 't';
        builtin_strncpy(acStack_1010,"ant 0.\n",8);
        local_1028.type._0_5_ = 0x6f20727450;
        local_1028.type._5_3_ = 0x726570;
        local_1028.kind = 0x20646e61;
        local_1028._12_1_ = 0x69;
        local_1028._13_1_ = 's';
        local_1028._14_2_ = 0x6e20;
        local_1038[0] = 'F';
        local_1038[1] = 'i';
        local_1038[2] = 'r';
        local_1038[3] = 's';
        local_1038[4] = 't';
        local_1038[5] = ' ';
        local_1038[6] = 'G';
        local_1038[7] = 'e';
        local_1038[8] = 't';
        local_1038[9] = 'E';
        local_1038[10] = 'l';
        local_1038[0xb] = 'e';
        local_1038[0xc] = 'm';
        local_1038[0xd] = 'e';
        local_1038[0xe] = 'n';
        local_1038[0xf] = 't';
LAB_00156805:
        pvVar11 = get_thread_log_callback_userdata();
        (*p_Var10)(pvVar11,Error,local_1038);
      }
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool analyze_getelementptr_instruction(Converter::Impl &impl, const llvm::GetElementPtrInst *inst)
{
	auto itr = impl.llvm_global_variable_to_resource_mapping.find(inst->getOperand(0));
	if (itr != impl.llvm_global_variable_to_resource_mapping.end() &&
	    !emit_getelementptr_resource(impl, inst, itr->second))
	{
		return false;
	}

	// If this GEP is associated with a tracked alloca, we might want to mask the GEP
	// if this GEP is actually never consumed.
	// Avoids lots of dead code being emitted which looks goofy in disassemblies.
	auto tracking = gep_pointer_to_alloca_tracked_inst(impl, inst);
	if (tracking.alloca_inst)
		impl.masked_alloca_forward_gep.insert(inst);

	return true;
}